

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

bool RestoreParentTypeScope(ExpressionContext *ctx,SynBase *source,TypeBase *parentType)

{
  uint uVar1;
  undefined8 *puVar2;
  TypeBase *pTVar3;
  TypeRef *pTVar4;
  long lVar5;
  ScopeData *scope;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TypeGenericAlias *type;
  longlong *plVar8;
  InplaceStr *pIVar9;
  uint *puVar10;
  SynIdentifier *pSVar11;
  
  if (parentType == (TypeBase *)0x0) {
    return false;
  }
  if (ctx->scope->ownerType == parentType) {
    bVar6 = false;
  }
  else {
    ExpressionContext::PushScope(ctx,parentType);
    if (parentType->typeID == 0x16) {
      pSVar11 = (SynIdentifier *)parentType[2]._vptr_TypeBase[10];
      while (pSVar11 != (SynIdentifier *)0x0) {
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
        scope = ctx->scope;
        type = ExpressionContext::GetGenericAliasType(ctx,pSVar11);
        uVar1 = ctx->uniqueAliasId;
        ctx->uniqueAliasId = uVar1 + 1;
        AliasData::AliasData
                  ((AliasData *)CONCAT44(extraout_var_01,iVar7),source,scope,&type->super_TypeBase,
                   pSVar11,uVar1);
        ExpressionContext::AddAlias(ctx,(AliasData *)CONCAT44(extraout_var_01,iVar7));
        pSVar11 = (SynIdentifier *)(pSVar11->super_SynBase).next;
        if ((pSVar11 == (SynIdentifier *)0x0) || ((pSVar11->super_SynBase).typeID != 4)) {
          pSVar11 = (SynIdentifier *)0x0;
        }
      }
    }
    else {
      if (parentType->typeID != 0x18) {
        return true;
      }
      plVar8 = &parentType[2].size;
      while (puVar2 = (undefined8 *)*plVar8, puVar2 != (undefined8 *)0x0) {
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
        pSVar11 = (SynIdentifier *)*puVar2;
        pTVar3 = (TypeBase *)puVar2[1];
        uVar1 = ctx->uniqueAliasId;
        ctx->uniqueAliasId = uVar1 + 1;
        AliasData::AliasData
                  ((AliasData *)CONCAT44(extraout_var,iVar7),source,ctx->scope,pTVar3,pSVar11,uVar1)
        ;
        ExpressionContext::AddAlias(ctx,(AliasData *)CONCAT44(extraout_var,iVar7));
        plVar8 = puVar2 + 2;
      }
      pIVar9 = (InplaceStr *)&parentType[2].refType;
      while (pTVar4 = (TypeRef *)pIVar9->begin, pTVar4 != (TypeRef *)0x0) {
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
        pSVar11 = (SynIdentifier *)(pTVar4->super_TypeBase)._vptr_TypeBase;
        pTVar3 = *(TypeBase **)&(pTVar4->super_TypeBase).typeID;
        uVar1 = ctx->uniqueAliasId;
        ctx->uniqueAliasId = uVar1 + 1;
        AliasData::AliasData
                  ((AliasData *)CONCAT44(extraout_var_00,iVar7),source,ctx->scope,pTVar3,pSVar11,
                   uVar1);
        ExpressionContext::AddAlias(ctx,(AliasData *)CONCAT44(extraout_var_00,iVar7));
        pIVar9 = &(pTVar4->super_TypeBase).name;
      }
      puVar10 = &parentType[1].typeID;
      while (lVar5 = *(long *)puVar10, lVar5 != 0) {
        ExpressionContext::AddVariable(ctx,*(VariableData **)(lVar5 + 8),true);
        puVar10 = (uint *)(lVar5 + 0x18);
      }
    }
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool RestoreParentTypeScope(ExpressionContext &ctx, SynBase *source, TypeBase *parentType)
{
	if(parentType && ctx.scope->ownerType != parentType)
	{
		ctx.PushScope(parentType);

		if(TypeClass *classType = getType<TypeClass>(parentType))
		{
			for(MatchData *el = classType->generics.head; el; el = el->next)
				ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(source, ctx.scope, el->type, el->name, ctx.uniqueAliasId++));

			for(MatchData *el = classType->aliases.head; el; el = el->next)
				ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(source, ctx.scope, el->type, el->name, ctx.uniqueAliasId++));

			for(MemberHandle *el = classType->members.head; el; el = el->next)
				ctx.AddVariable(el->variable, true);
		}
		else if(TypeGenericClassProto *genericProto = getType<TypeGenericClassProto>(parentType))
		{
			SynClassDefinition *definition = genericProto->definition;

			for(SynIdentifier *curr = definition->aliases.head; curr; curr = getType<SynIdentifier>(curr->next))
				ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(source, ctx.scope, ctx.GetGenericAliasType(curr), curr, ctx.uniqueAliasId++));
		}

		return true;
	}

	return false;
}